

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getFileAux<llvm::WritableMemoryBuffer>
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,
            uint64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  byte bVar1;
  bool bVar2;
  int FD_00;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  int *piVar8;
  ssize_t sVar9;
  undefined8 uVar10;
  _func_int *__buf;
  long lVar11;
  error_code eVar12;
  int FD;
  file_status Status;
  int local_ac;
  int local_94;
  undefined8 local_90;
  undefined1 local_88 [24];
  uid_t uStack_70;
  gid_t local_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  file_type fStack_60;
  perms local_5c;
  dev_t local_58;
  nlink_t nStack_50;
  ino_t local_48;
  NamedBufferAlloc local_38;
  
  eVar12 = llvm::sys::fs::openFileForRead(Filename,&local_94,F_None,(SmallVectorImpl<char> *)0x0);
  FD_00 = local_94;
  if (eVar12._M_value != 0) {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar12._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar12._M_cat;
    return __return_storage_ptr__;
  }
  if (getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize == '\0') {
    getFileAux<llvm::WritableMemoryBuffer>();
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == -1)) {
    uStack_68 = 0;
    uStack_64 = 0;
    fStack_60 = status_error;
    local_88._16_8_ = (char *)0x0;
    uStack_70 = 0;
    local_6c = 0;
    local_88._0_8_ = (_func_int **)0x0;
    local_88._8_8_ = (error_category *)0x0;
    local_5c = perms_not_known;
    local_58 = 0;
    nStack_50 = 0;
    local_48 = 0;
    eVar12 = llvm::sys::fs::status(FD_00,(file_status *)local_88);
    if (eVar12._M_value == 0) {
      if ((fStack_60 != regular_file) && (fStack_60 != block_file)) {
        getMemoryBufferForStream(__return_storage_ptr__,FD_00,Filename);
        goto LAB_0014e10c;
      }
      bVar2 = true;
      MapSize = CONCAT44(uStack_64,uStack_68);
    }
    else {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
      *(int *)&__return_storage_ptr__->field_0 = eVar12._M_value;
      *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar12._M_cat;
LAB_0014e10c:
      MapSize = 0xffffffffffffffff;
      bVar2 = false;
    }
    if (!bVar2) goto LAB_0014e389;
  }
  if (((!RequiresNullTerminator) && (0x3fff < MapSize)) &&
     (getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize <= MapSize)) {
    local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
    local_88._8_8_ = std::_V2::system_category();
    local_38.Name = Filename;
    plVar6 = (long *)operator_new(0x30,&local_38);
    *plVar6 = (long)&PTR__MemoryBufferMMapFile_0023f8b8;
    iVar4 = llvm::sys::fs::mapped_file_region::alignment();
    iVar5 = llvm::sys::fs::mapped_file_region::alignment();
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar6 + 3),FD_00,priv,((long)(iVar4 + -1) & Offset) + MapSize
               ,(long)-iVar5 & Offset,(error_code *)local_88);
    if (local_88._0_4_ == 0) {
      pcVar7 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar6 + 3));
      iVar4 = llvm::sys::fs::mapped_file_region::alignment();
      plVar6[1] = (long)(pcVar7 + ((long)(iVar4 + -1) & Offset));
      plVar6[2] = (long)(pcVar7 + ((long)(iVar4 + -1) & Offset) + MapSize);
    }
    uVar3 = local_88._0_4_;
    if (local_88._0_4_ == 0) {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
      *(long **)&__return_storage_ptr__->field_0 = plVar6;
      plVar6 = (long *)0x0;
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    if (uVar3 == 0) goto LAB_0014e389;
  }
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)local_88,MapSize,Filename);
  if ((_func_int **)local_88._0_8_ == (_func_int **)0x0) {
    uVar10 = std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(undefined4 *)&__return_storage_ptr__->field_0 = 0xc;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar10;
  }
  else {
    __buf = *(_func_int **)(local_88._0_8_ + 8);
    lVar11 = Offset + MapSize;
    bVar1 = __return_storage_ptr__->field_0x10;
    local_ac = *(int *)&__return_storage_ptr__->field_0;
    local_90 = *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8);
    do {
      if (MapSize == 0) goto LAB_0014e317;
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        sVar9 = pread(FD_00,__buf,MapSize,lVar11 - MapSize);
        if (sVar9 != -1) {
          if (sVar9 == 0) {
            memset(__buf,0,MapSize);
            iVar4 = 3;
          }
          else {
            MapSize = MapSize - sVar9;
            __buf = __buf + sVar9;
            iVar4 = 0;
          }
          goto LAB_0014e305;
        }
        iVar5 = *piVar8;
      } while (iVar5 == 4);
      local_90 = std::_V2::generic_category();
      bVar1 = bVar1 | 1;
      iVar4 = 1;
      local_ac = iVar5;
LAB_0014e305:
    } while (iVar4 == 0);
    if (iVar4 == 3) {
LAB_0014e317:
      *(int *)&__return_storage_ptr__->field_0 = local_ac;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_90;
      __return_storage_ptr__->field_0x10 = bVar1 & 0xfe;
      *(undefined8 *)&__return_storage_ptr__->field_0 = local_88._0_8_;
      local_88._0_8_ = (_func_int **)0x0;
    }
    else {
      __return_storage_ptr__->field_0x10 = bVar1;
      *(int *)&__return_storage_ptr__->field_0 = local_ac;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_90;
    }
  }
  if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
  }
LAB_0014e389:
  close(local_94);
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}